

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::Draw::anon_unknown_10::DrawInstancedIndexed::iterate
          (TestStatus *__return_storage_ptr__,DrawInstancedIndexed *this)

{
  VkPrimitiveTopology VVar1;
  Context *this_00;
  TestLog *pTVar2;
  DeviceInterface *pDVar3;
  Allocation *pAVar4;
  pointer __dest;
  Buffer *pBVar5;
  deUint64 dVar6;
  Image *this_01;
  undefined1 auVar7 [16];
  VkQueue pVVar8;
  TestStatus *pTVar9;
  bool bVar10;
  VkResult VVar11;
  VkDevice pVVar12;
  Allocator *pAVar13;
  char *__s;
  int iVar14;
  int y;
  VkDeviceSize _size;
  int x;
  int x_00;
  int iVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_XMM0 [16];
  double dVar19;
  undefined8 uVar20;
  allocator<char> local_169;
  VkQueue local_168;
  undefined8 local_160;
  undefined4 local_158;
  TestStatus *local_150;
  DrawInstancedIndexed *local_148;
  TestLog *local_140;
  double local_138;
  double local_130;
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  string local_a8 [32];
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.m_context;
  pTVar2 = this_00->m_testCtx->m_log;
  local_150 = __return_storage_ptr__;
  local_168 = Context::getUniversalQueue(this_00);
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  _size = (long)(this->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar12 = Context::getDevice((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance
                               .m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,_size,0x40,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0);
  pAVar13 = Context::getDefaultAllocator
                      ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar3,pVVar12,(VkBufferCreateInfo *)&referenceFrame,pAVar13,
             (MemoryRequirement)0x1);
  local_140 = pTVar2;
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&(this->super_DrawIndexed).m_indexBuffer,(SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&referenceFrame.m_width);
  pAVar4 = (((this->super_DrawIndexed).m_indexBuffer.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  __dest = (pointer)pAVar4->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,(this->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,_size);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar12 = Context::getDevice((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance
                               .m_context);
  pBVar5 = (this->super_DrawIndexed).m_indexBuffer.m_ptr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar4->m_hostPtr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00bf5e28;
  submitInfo.pNext = (void *)(pAVar4->m_memory).m_internal;
  submitInfo._16_8_ = pAVar4->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar4->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar12,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,_size);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  vertexBuffer.m_internal =
       (((this->super_DrawIndexed).super_DrawTestsBaseClass.m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  dVar6 = (((this->super_DrawIndexed).m_indexBuffer.m_ptr)->m_object).
          super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x58])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x57])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,dVar6,0);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawIndexed).super_DrawTestsBaseClass.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  VVar1 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_topology;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    uVar20 = 6;
  }
  else {
    if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) goto LAB_006853b8;
    uVar20 = 4;
  }
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x5a])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,uVar20,4,2,0xd,2);
LAB_006853b8:
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4a])
            (pDVar3,(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar8 = local_168;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  submitInfo.pCommandBuffers =
       (VkCommandBuffer *)&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer;
  VVar11 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,local_168,1);
  ::vk::checkResult(VVar11,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x131);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar11 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar8);
  ::vk::checkResult(VVar11,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x133);
  pDVar3 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar11 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar8);
  ::vk::checkResult(VVar11,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x136);
  local_148 = this;
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawIndexed).super_DrawTestsBaseClass.m_colorAttachmentFormat)
  ;
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  auVar18 = ZEXT816(0x3fe0000000000000);
  y = 0;
  iVar14 = referenceFrame.m_width;
  if (referenceFrame.m_width < 1) {
    iVar14 = 0;
  }
  local_138 = (double)referenceFrame.m_height * 0.5;
  iVar15 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar15 = 0;
  }
  dVar19 = (double)referenceFrame.m_width * 0.5;
  local_130 = dVar19;
  for (; y != iVar15; y = y + 1) {
    fVar16 = (float)((double)y / local_138) + -1.0;
    auVar17._8_8_ = -(ulong)(0.0 < auVar18._8_8_);
    auVar17._0_8_ = -(ulong)(0.3 < fVar16);
    auVar7._8_8_ = -(ulong)(auVar18._8_8_ < 0.0);
    auVar7._0_8_ = -(ulong)(fVar16 < -0.6);
    auVar18 = auVar17 | auVar7;
    for (x_00 = 0; iVar14 != x_00; x_00 = x_00 + 1) {
      if (((auVar17 | auVar7) & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar18._0_8_ = (double)((float)((double)x_00 / dVar19) + -1.0);
        if ((-0.3 <= auVar18._0_8_) && (auVar18._0_8_ <= 0.6)) {
          renderedFrame.m_format.order = R;
          renderedFrame.m_format.type = SNORM_INT8;
          renderedFrame.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
          tcu::PixelBufferAccess::setPixel
                    (referenceFrame.super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
          auVar18 = extraout_XMM0;
          dVar19 = local_130;
        }
      }
    }
  }
  this_01 = (local_148->super_DrawIndexed).super_DrawTestsBaseClass.m_colorTargetImage.m_ptr;
  pAVar13 = Context::getDefaultAllocator
                      ((local_148->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  local_158 = 0;
  local_160 = 0;
  Image::readSurface(&renderedFrame,this_01,local_168,pAVar13,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar10 = tcu::fuzzyCompare(local_140,"Result","Image comparison result",
                             &(referenceFrame.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar10);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,__s,&local_169);
  pTVar9 = local_150;
  local_150->m_code = (uint)!bVar10;
  std::__cxx11::string::string((string *)&local_150->m_description,local_a8);
  std::__cxx11::string::~string(local_a8);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar9;
}

Assistant:

tcu::TestStatus DrawInstancedIndexed::iterate (void)
{
	tcu::TestLog &log		= m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize dataSize = m_indexes.size() * sizeof(deUint32);
	m_indexBuffer = Buffer::createAndAlloc(	m_vk, m_context.getDevice(),
											BufferCreateInfo(dataSize,
															 vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT),
											m_context.getDefaultAllocator(),
											vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indexBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_indexes[0], static_cast<size_t>(dataSize));
	vk::flushMappedMemoryRange(m_vk, m_context.getDevice(),
							   m_indexBuffer->getBoundMemory().getMemory(),
							   m_indexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
	const vk::VkBuffer indexBuffer = m_indexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, indexBuffer, 0, vk::VK_INDEX_TYPE_UINT32);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 6, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 4, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth = referenceFrame.getWidth();
	const deInt32 frameHeight = referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}